

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  uint uVar1;
  ColorTree *pCVar2;
  byte bVar3;
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  undefined7 in_register_00000081;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = CONCAT71(in_register_00000081,a);
  for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
    bVar3 = (byte)uVar5;
    uVar1 = (uint)(((uint)uVar4 >> (uVar5 & 0x1f) & 1) != 0) +
            (CONCAT31(in_register_00000011,g) >> (bVar3 & 0x1f) & 1) * 4 +
            (CONCAT31(in_register_00000031,r) >> (bVar3 & 0x1f) & 1) * 8 +
            ((uint)CONCAT71(in_register_00000009,b) >> (bVar3 & 0x1f) & 1) * 2;
    pCVar2 = tree->children[uVar1];
    if (pCVar2 == (ColorTree *)0x0) {
      pCVar2 = (ColorTree *)malloc(0x88);
      tree->children[uVar1] = pCVar2;
      color_tree_init(pCVar2);
      uVar4 = CONCAT71(in_register_00000081,a) & 0xffffffff;
      pCVar2 = tree->children[uVar1];
    }
    tree = pCVar2;
  }
  tree->index = index;
  return;
}

Assistant:

static void color_tree_add(ColorTree* tree,
                           unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index)
{
  int bit;
  for(bit = 0; bit < 8; ++bit)
  {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i])
    {
      tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
      color_tree_init(tree->children[i]);
    }
    tree = tree->children[i];
  }
  tree->index = (int)index;
}